

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# masterserver.cpp
# Opt level: O0

int __thiscall CMasterServer::RefreshAddresses(CMasterServer *this,int Nettype)

{
  undefined4 in_ESI;
  long in_RDI;
  int i;
  int local_18;
  int local_4;
  
  if ((*(int *)(in_RDI + 0x5b0) == 0) || (*(int *)(in_RDI + 0x5b0) == 2)) {
    dbg_msg("engine/mastersrv","refreshing master server addresses");
    for (local_18 = 0; local_18 < 4; local_18 = local_18 + 1) {
      (**(code **)(**(long **)(in_RDI + 0x5b8) + 0x30))
                (*(long **)(in_RDI + 0x5b8),in_RDI + (long)local_18 * 0x168 + 0xb0,
                 in_RDI + 0x10 + (long)local_18 * 0x168,in_ESI);
      *(undefined1 *)(in_RDI + (long)local_18 * 0x168 + 0xa8) = 0;
    }
    *(undefined4 *)(in_RDI + 0x5b0) = 1;
    local_4 = 0;
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

virtual int RefreshAddresses(int Nettype)
	{
		if(m_State != STATE_INIT && m_State != STATE_READY)
			return -1;

		dbg_msg("engine/mastersrv", "refreshing master server addresses");

		// add lookup jobs
		for(int i = 0; i < MAX_MASTERSERVERS; i++)
		{
			m_pEngine->HostLookup(&m_aMasterServers[i].m_Lookup, m_aMasterServers[i].m_aHostname, Nettype);
			m_aMasterServers[i].m_Valid = false;
		}

		m_State = STATE_UPDATE;
		return 0;
	}